

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::ArenaTest_BlockSizeSmallerThanAllocation_Test::TestBody
          (ArenaTest_BlockSizeSmallerThanAllocation_Test *this)

{
  undefined8 *puVar1;
  pointer *__ptr;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  AllocationPolicy res;
  Arena arena;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  AssertHelper local_100;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  _func_void_ptr_size_t *local_e8;
  _func_void_void_ptr_size_t *p_Stack_e0;
  ThreadSafeArena local_d8;
  
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    local_e8 = (_func_void_ptr_size_t *)0x0;
    p_Stack_e0 = (_func_void_void_ptr_size_t *)0x0;
    local_f8 = (undefined1  [8])pbVar3;
    local_f0 = pbVar3;
    protobuf::internal::ThreadSafeArena::ThreadSafeArena
              (&local_d8,(void *)0x0,0,(AllocationPolicy *)local_f8);
    puVar1 = (undefined8 *)Arena::Allocate((Arena *)&local_d8,8);
    *puVar1 = 0x2a;
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ThreadSafeArena::SpaceAllocated(&local_d8);
    local_100.data_._0_4_ = 8;
    testing::internal::CmpHelperGE<unsigned_long,int>
              ((internal *)local_f8,"arena.SpaceAllocated()","8",(unsigned_long *)&local_108,
               (int *)&local_100);
    if (local_f8[0] == '\0') {
      testing::Message::Message((Message *)&local_108);
      pcVar2 = anon_var_dwarf_a22956 + 5;
      if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = (local_f0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x6d8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_108._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108._M_head_impl + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    local_100.data_._0_4_ = 8;
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ThreadSafeArena::SpaceUsed(&local_d8);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_f8,"8","arena.SpaceUsed()",(int *)&local_100,
               (unsigned_long *)&local_108);
    if (local_f8[0] == '\0') {
      testing::Message::Message((Message *)&local_108);
      pcVar2 = anon_var_dwarf_a22956 + 5;
      if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = (local_f0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x6d9,pcVar2);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_108._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108._M_head_impl + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    puVar1 = (undefined8 *)Arena::Allocate((Arena *)&local_d8,8);
    *puVar1 = 0x2a;
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ThreadSafeArena::SpaceAllocated(&local_d8);
    local_100.data_._0_4_ = 0x10;
    testing::internal::CmpHelperGE<unsigned_long,int>
              ((internal *)local_f8,"arena.SpaceAllocated()","16",(unsigned_long *)&local_108,
               (int *)&local_100);
    if (local_f8[0] == '\0') {
      testing::Message::Message((Message *)&local_108);
      pcVar2 = anon_var_dwarf_a22956 + 5;
      if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = (local_f0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x6dc,pcVar2);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_108._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108._M_head_impl + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    local_100.data_._0_4_ = 0x10;
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ThreadSafeArena::SpaceUsed(&local_d8);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_f8,"16","arena.SpaceUsed()",(int *)&local_100,
               (unsigned_long *)&local_108);
    if (local_f8[0] == '\0') {
      testing::Message::Message((Message *)&local_108);
      pcVar2 = anon_var_dwarf_a22956 + 5;
      if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = (local_f0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x6dd,pcVar2);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_108._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108._M_head_impl + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_d8);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(pbVar3->_M_dataplus)._M_p + 1);
  } while (pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DAT_00000009);
  return;
}

Assistant:

TEST(ArenaTest, BlockSizeSmallerThanAllocation) {
  for (size_t i = 0; i <= 8; ++i) {
    ArenaOptions opt;
    opt.start_block_size = opt.max_block_size = i;
    Arena arena(opt);

    *Arena::Create<int64_t>(&arena) = 42;
    EXPECT_GE(arena.SpaceAllocated(), 8);
    EXPECT_EQ(8, arena.SpaceUsed());

    *Arena::Create<int64_t>(&arena) = 42;
    EXPECT_GE(arena.SpaceAllocated(), 16);
    EXPECT_EQ(16, arena.SpaceUsed());
  }
}